

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

float trng::math::detail::inv_Beta_I<float>(float x,float p,float q,float norm)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar6;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Db;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar7 [16];
  
  fVar2 = 0.0;
  if (1.1920929e-07 <= x) {
    fVar2 = 1.0;
    if (1.1920929e-07 <= 1.0 - x) {
      if ((p + p < 1.0) || (q + q < 1.0)) {
        fVar2 = logf(p / (p + q));
        fVar10 = logf(q / (p + q));
        fVar2 = expf(fVar2 * p);
        fVar10 = expf(fVar10 * q);
        auVar8._4_4_ = extraout_XMM0_Db;
        auVar8._0_4_ = fVar2;
        auVar8._8_4_ = extraout_XMM0_Db;
        auVar8._12_4_ = extraout_XMM0_Db_00;
        auVar7._8_8_ = auVar8._8_8_;
        auVar7._4_4_ = fVar10;
        auVar7._0_4_ = fVar2;
        auVar9._4_4_ = q;
        auVar9._0_4_ = p;
        auVar9._8_4_ = in_XMM1_Db;
        auVar9._12_4_ = in_XMM2_Db;
        auVar9 = divps(auVar7,auVar9);
        fVar2 = auVar9._4_4_ + auVar9._0_4_;
        if (auVar9._0_4_ / fVar2 <= x) {
          fVar10 = powf((1.0 - x) * fVar2 * q,1.0 / q);
          fVar10 = 1.0 - fVar10;
        }
        else {
          fVar10 = powf(fVar2 * p * x,1.0 / p);
        }
      }
      else {
        fVar10 = (p * 3.0 + -1.0) / (q * 3.0 + p * 3.0 + -2.0);
      }
      iVar1 = 0;
      do {
        fVar3 = Beta_I<float>(fVar10,p,q,norm);
        fVar4 = powf(1.0 - fVar10,q + -1.0);
        fVar5 = powf(fVar10,p + -1.0);
        fVar6 = ABS((fVar3 - x) / fVar10);
        fVar2 = fVar10;
        if (2.3841858e-07 <= fVar6) {
          fVar3 = (fVar3 - x) / ((fVar4 * fVar5) / norm);
          fVar2 = fVar10 - fVar3;
          if (0.0 < fVar2) goto LAB_002219f3;
          do {
            do {
              fVar3 = fVar3 * 0.75;
              fVar2 = fVar10 - fVar3;
            } while (fVar2 <= 0.0);
LAB_002219f3:
          } while (1.0 <= fVar2);
        }
      } while ((2.3841858e-07 <= fVar6) && (iVar1 = iVar1 + 1, fVar10 = fVar2, iVar1 != 0x18));
    }
  }
  return fVar2;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Beta_I(T x, T p, T q, T norm) {
        if (x < numeric_limits<T>::epsilon())
          return 0;
        if (1 - x < numeric_limits<T>::epsilon())
          return 1;
        // solve via Newton method
        T y{0};
        if (2 * p >= 1 and 2 * q >= 1)
          y = (3 * p - 1) / (3 * p + 3 * q - 2);  // the approximate median
        else {
          // following initial guess given in "Numerical Recipes" by W. H. Press et al., 3rd
          // edition
          const T lnp{ln(p / (p + q))};
          const T lnq{ln(q / (p + q))};
          const T t{exp(p * lnp) / p};
          const T u{exp(q * lnq) / q};
          const T w{t + u};
          if (x < t / w)
            y = pow(p * w * x, 1 / p);
          else
            y = 1 - pow(q * w * (1 - x), 1 / q);
        }
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          const T f{Beta_I(y, p, q, norm) - x};
          const T df{pow(1 - y, q - 1) * pow(y, p - 1) / norm};
          T dy(f / df);
          if (abs(f / y) < 2 * numeric_limits<T>::epsilon())
            break;
          // avoid overshooting
          while (y - dy <= 0 or y - dy >= 1)
            dy *= T{3} / T{4};
          y -= dy;
        }
        return y;
      }